

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t nread;
  char buffer [8192];
  curl_mimepart toppart;
  CURLcode result;
  curl_formget_callback append_local;
  void *arg_local;
  curl_httppost *form_local;
  
  Curl_mime_initpart((curl_mimepart *)(buffer + 0x1ff8),(Curl_easy *)0x0);
  toppart.encstate.buf._252_4_ =
       Curl_getformdata((Curl_easy *)0x0,(curl_mimepart *)(buffer + 0x1ff8),form,
                        (curl_read_callback)0x0);
  if (toppart.encstate.buf._252_4_ == CURLE_OK) {
    toppart.encstate.buf._252_4_ =
         Curl_mime_prepare_headers
                   ((curl_mimepart *)(buffer + 0x1ff8),"multipart/form-data",(char *)0x0,
                    MIMESTRATEGY_FORM);
  }
  while ((toppart.encstate.buf._252_4_ == 0 &&
         (sVar2 = Curl_mime_read((char *)&nread,1,0x2000,buffer + 0x1ff8), sVar2 != 0))) {
    if ((1 < sVar2 - 0x10000000) && (sVar3 = (*append)(arg,(char *)&nread,sVar2), sVar3 != sVar2)) {
      toppart.encstate.buf[0xfc] = '\x1a';
      toppart.encstate.buf[0xfd] = '\0';
      toppart.encstate.buf[0xfe] = '\0';
      toppart.encstate.buf[0xff] = '\0';
    }
  }
  Curl_mime_cleanpart((curl_mimepart *)(buffer + 0x1ff8));
  iVar1._0_1_ = toppart.encstate.buf[0xfc];
  iVar1._1_1_ = toppart.encstate.buf[0xfd];
  iVar1._2_1_ = toppart.encstate.buf[0xfe];
  iVar1._3_1_ = toppart.encstate.buf[0xff];
  return iVar1;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_mimepart toppart;

  Curl_mime_initpart(&toppart, NULL); /* default form is empty */
  result = Curl_getformdata(NULL, &toppart, form, NULL);
  if(!result)
    result = Curl_mime_prepare_headers(&toppart, "multipart/form-data",
                                       NULL, MIMESTRATEGY_FORM);

  while(!result) {
    char buffer[8192];
    size_t nread = Curl_mime_read(buffer, 1, sizeof(buffer), &toppart);

    if(!nread)
      break;

    switch(nread) {
    default:
      if(append(arg, buffer, nread) != nread)
        result = CURLE_READ_ERROR;
      break;
    case CURL_READFUNC_ABORT:
    case CURL_READFUNC_PAUSE:
      break;
    }
  }

  Curl_mime_cleanpart(&toppart);
  return (int) result;
}